

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

bool __thiscall
google::protobuf::DescriptorPool::InternalIsFileLoaded(DescriptorPool *this,string *filename)

{
  const_iterator cVar1;
  bool bVar2;
  MutexLockMaybe lock;
  MutexLockMaybe local_20;
  pointer local_18;
  
  internal::MutexLockMaybe::MutexLockMaybe(&local_20,this->mutex_);
  local_18 = (filename->_M_dataplus)._M_p;
  cVar1 = std::
          _Hashtable<const_char_*,_std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_std::__detail::_Select1st,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(((this->tables_)._M_t.
                    super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                    .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
                   _M_head_impl)->files_by_name_)._M_h,&local_18);
  if (cVar1.
      super__Node_iterator_base<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_true>
      ._M_cur == (__node_type *)0x0) {
    bVar2 = false;
  }
  else {
    bVar2 = *(long *)((long)cVar1.
                            super__Node_iterator_base<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_true>
                            ._M_cur + 0x10) != 0;
  }
  if ((pthread_mutex_t *)local_20.mu_ != (pthread_mutex_t *)0x0) {
    pthread_mutex_unlock((pthread_mutex_t *)local_20.mu_);
  }
  return bVar2;
}

Assistant:

bool DescriptorPool::InternalIsFileLoaded(const std::string& filename) const {
  MutexLockMaybe lock(mutex_);
  return tables_->FindFile(filename) != nullptr;
}